

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook.c
# Opt level: O3

int funchook_destroy(funchook_t *funchook)

{
  funchook_page *pfVar1;
  funchook_page_t *page;
  undefined8 uVar2;
  
  funchook_log(funchook,"Enter funchook_destroy(%p)\n",funchook);
  if (funchook == (funchook_t *)0x0) {
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = 2;
    if (funchook->installed != 0) goto LAB_0010187d;
    page = funchook->page_list;
    while (page != (funchook_page_t *)0x0) {
      pfVar1 = page->next;
      funchook_page_free(funchook,page);
      page = pfVar1;
    }
    if ((FILE *)funchook->fp != (FILE *)0x0) {
      fclose((FILE *)funchook->fp);
    }
    funchook_free(funchook);
    uVar2 = 0;
  }
  funchook = (funchook_t *)0x0;
LAB_0010187d:
  funchook_log_end(funchook,"Leave funchook_destroy() => %d\n",uVar2);
  return (int)uVar2;
}

Assistant:

int funchook_destroy(funchook_t *funchook)
{
    int rv;

    funchook_log(funchook, "Enter funchook_destroy(%p)\n", funchook);
    rv = funchook_destroy_internal(funchook);
    funchook_log_end(rv == 0 ? NULL : funchook, "Leave funchook_destroy() => %d\n", rv);
    return rv;
}